

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTsim.c
# Opt level: O2

Aig_Man_t *
Aig_ManConstReduce(Aig_Man_t *p,int fUseMvSweep,int nFramesSymb,int nFramesSatur,int fVerbose,
                  int fVeryVerbose)

{
  Vec_Ptr_t *vMap;
  Aig_Man_t *p_00;
  
  while( true ) {
    if (p->nRegs < 1) {
      return p;
    }
    if (fUseMvSweep == 0) {
      vMap = Aig_ManTernarySimulate(p,fVerbose,fVeryVerbose);
    }
    else {
      vMap = Saig_MvManSimulate(p,nFramesSymb,nFramesSatur,fVerbose,fVeryVerbose);
    }
    if (vMap == (Vec_Ptr_t *)0x0) break;
    p_00 = Aig_ManRemap(p,vMap);
    Vec_PtrFree(vMap);
    Aig_ManSeqCleanup(p_00);
    if (fVerbose != 0) {
      Aig_ManReportImprovement(p,p_00);
    }
    Aig_ManStop(p);
    p = p_00;
  }
  return p;
}

Assistant:

Aig_Man_t * Aig_ManConstReduce( Aig_Man_t * p, int fUseMvSweep, int nFramesSymb, int nFramesSatur, int fVerbose, int fVeryVerbose )
{
    Aig_Man_t * pTemp;
    Vec_Ptr_t * vMap;
    while ( Aig_ManRegNum(p) > 0 )
    {
        if ( fUseMvSweep )
            vMap = Saig_MvManSimulate( p, nFramesSymb, nFramesSatur, fVerbose, fVeryVerbose );
        else
            vMap = Aig_ManTernarySimulate( p, fVerbose, fVeryVerbose );
        if ( vMap == NULL )
            break;
        p = Aig_ManRemap( pTemp = p, vMap );
        Vec_PtrFree( vMap );
        Aig_ManSeqCleanup( p );
        if ( fVerbose )
            Aig_ManReportImprovement( pTemp, p );
        Aig_ManStop( pTemp );
    }
    return p;
}